

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall
aeron::ClientConductor::onUnavailableCounter
          (ClientConductor *this,int64_t registrationId,int32_t counterId)

{
  int iVar1;
  int32_t local_2c;
  int64_t local_28;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  local_2c = counterId;
  local_28 = registrationId;
  if ((this->m_onUnavailableCounterHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_onUnavailableCounterHandler)._M_invoker)
              ((_Any_data *)&this->m_onUnavailableCounterHandler,&this->m_countersReader,&local_28,
               &local_2c);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void ClientConductor::onUnavailableCounter(
    std::int64_t registrationId,
    std::int32_t counterId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    m_onUnavailableCounterHandler(m_countersReader, registrationId, counterId);
}